

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

void roaring64_bitmap_andnot_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  container_t *c;
  uint8_t type;
  art_val_t *__ptr;
  _Bool _Var1;
  int iVar2;
  container_t *pcVar3;
  byte type2;
  uint8_t typecode2;
  byte local_151 [9];
  roaring64_bitmap_t *local_148;
  art_iterator_t it1;
  art_iterator_t it2;
  
  local_148 = r1;
  art_init_iterator(&it1,&r1->art,true);
  art_init_iterator(&it2,&r2->art,true);
  do {
    while( true ) {
      if (it1.value == (art_val_t *)0x0) {
        return;
      }
      if (it2.value != (art_val_t *)0x0) break;
LAB_0010bbf2:
      art_iterator_next(&it1);
    }
    iVar2 = art_compare_keys(it1.key,it2.key);
    __ptr = it1.value;
    if (iVar2 == 0) {
      c = *(container_t **)(it1.value[1].key + 2);
      local_151[0] = it1.value[1].key[0];
      pcVar3 = *(container_t **)(it2.value[1].key + 2);
      type2 = it2.value[1].key[0];
      if (local_151[0] != 4) {
        get_writable_copy_if_shared(c,local_151);
        if (type2 == 4) {
          type2 = *(byte *)((long)pcVar3 + 8);
        }
        local_151[1] = 0;
        local_151[2] = 0;
        local_151[3] = 0;
        local_151[4] = 0;
        local_151[5] = 0;
        local_151[6] = 0;
        local_151[7] = 0;
        local_151[8] = 0;
        (*(code *)(&DAT_0012dd84 +
                  *(int *)(&DAT_0012dd84 + (ulong)(((uint)type2 + (uint)local_151[0] * 4) - 5) * 4))
        )();
        return;
      }
      pcVar3 = container_andnot(c,'\x04',pcVar3,type2,&typecode2);
      if (pcVar3 != c) {
        container_free(c,'\x04');
      }
      type = typecode2;
      if (pcVar3 != c) {
        *(container_t **)(__ptr[1].key + 2) = pcVar3;
        __ptr[1].key[0] = typecode2;
      }
      _Var1 = container_nonzero_cardinality(pcVar3,typecode2);
      if (_Var1) {
        art_iterator_next(&it1);
      }
      else {
        container_free(pcVar3,type);
        art_iterator_erase(&local_148->art,&it1);
        roaring_free(__ptr);
      }
    }
    else if (iVar2 < 0) goto LAB_0010bbf2;
    art_iterator_next(&it2);
  } while( true );
}

Assistant:

void roaring64_bitmap_andnot_inplace(roaring64_bitmap_t *r1,
                                     const roaring64_bitmap_t *r2) {
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. it1_present && !it2_present -> it1++
        // 2. it1_present &&  it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 - it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                container_t *container1 = leaf1->container;
                uint8_t typecode1 = leaf1->typecode;
                uint8_t typecode2;
                container_t *container2;
                if (leaf1->typecode == SHARED_CONTAINER_TYPE) {
                    container2 = container_andnot(
                        leaf1->container, leaf1->typecode, leaf2->container,
                        leaf2->typecode, &typecode2);
                    if (container2 != container1) {
                        // We only free when doing container_andnot, not
                        // container_iandnot, as iandnot frees the original
                        // internally.
                        container_free(container1, typecode1);
                    }
                } else {
                    container2 = container_iandnot(
                        leaf1->container, leaf1->typecode, leaf2->container,
                        leaf2->typecode, &typecode2);
                }
                if (container2 != container1) {
                    leaf1->container = container2;
                    leaf1->typecode = typecode2;
                }

                if (!container_nonzero_cardinality(container2, typecode2)) {
                    container_free(container2, typecode2);
                    art_iterator_erase(&r1->art, &it1);
                    free_leaf(leaf1);
                } else {
                    // Only advance the iterator if we didn't delete the
                    // leaf, as erasing advances by itself.
                    art_iterator_next(&it1);
                }
                art_iterator_next(&it2);
            }
        }
        if (!it2_present || compare_result < 0) {
            // Cases 1 and 2a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_next(&it2);
        }
    }
}